

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O3

bool __thiscall Nibbler::getUntilRx(Nibbler *this,string *regex,string *result)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  vector<int,_std::allocator<int>_> start;
  vector<int,_std::allocator<int>_> end;
  RX r;
  string local_f8;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_b8;
  RX local_a0;
  
  uVar1 = this->_length;
  uVar2 = this->_cursor;
  if (uVar2 < uVar1) {
    RX::RX(&local_a0,regex,true);
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)this);
    bVar3 = RX::match(&local_a0,&local_d8,&local_b8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)this);
      std::__cxx11::string::operator=((string *)result,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      sVar4 = (long)*local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + this->_cursor;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)this);
      std::__cxx11::string::operator=((string *)result,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      sVar4 = this->_length;
    }
    this->_cursor = sVar4;
    if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    RX::~RX(&local_a0);
  }
  return uVar2 < uVar1;
}

Assistant:

bool Nibbler::getUntilRx (const std::string& regex, std::string& result)
{
  if (_cursor < _length)
  {
    RX r (regex, true);
    std::vector <int> start;
    std::vector <int> end;
    if (r.match (start, end, _input.substr (_cursor)))
    {
      result = _input.substr (_cursor, start[0]);
      _cursor += start[0];
    }
    else
    {
      result = _input.substr (_cursor);
      _cursor = _length;
    }

    return true;
  }

  return false;
}